

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O1

void __thiscall
icu_63::ChineseCalendar::ChineseCalendar
          (ChineseCalendar *this,Locale *aLocale,int32_t epochYear,TimeZone *zoneAstroCalc,
          UErrorCode *success)

{
  TimeZone *zone;
  UDate millis;
  
  zone = TimeZone::createDefault();
  Calendar::Calendar(&this->super_Calendar,zone,aLocale,success);
  (this->super_Calendar).super_UObject._vptr_UObject = (_func_int **)&PTR__ChineseCalendar_003ee178;
  (this->super_Calendar).field_0x262 = 0;
  *(int32_t *)&(this->super_Calendar).field_0x264 = epochYear;
  this->fZoneAstroCalc = zoneAstroCalc;
  millis = Calendar::getNow();
  Calendar::setTimeInMillis(&this->super_Calendar,millis,success);
  return;
}

Assistant:

ChineseCalendar::ChineseCalendar(const Locale& aLocale, int32_t epochYear,
                                const TimeZone* zoneAstroCalc, UErrorCode &success)
:   Calendar(TimeZone::createDefault(), aLocale, success),
    isLeapYear(FALSE),
    fEpochYear(epochYear),
    fZoneAstroCalc(zoneAstroCalc)
{
    setTimeInMillis(getNow(), success); // Call this again now that the vtable is set up properly.
}